

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O2

void __thiscall
happly::TypedListProperty<unsigned_char>::writeDataASCII
          (TypedListProperty<unsigned_char> *this,ostream *outStream,size_t iElement)

{
  pointer puVar1;
  ulong uVar2;
  ostream *this_00;
  runtime_error *this_01;
  size_t iFlat;
  unsigned_long uVar3;
  
  puVar1 = (this->flattenedIndexStart).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = puVar1[iElement + 1];
  uVar3 = puVar1[iElement];
  if (uVar2 - uVar3 < 0x100) {
    std::ostream::_M_insert<unsigned_long>((ulong)outStream);
    *(undefined8 *)(outStream + *(long *)(*(long *)outStream + -0x18) + 8) = 0;
    for (; uVar3 < uVar2; uVar3 = uVar3 + 1) {
      this_00 = std::operator<<((ostream *)outStream," ");
      std::ostream::operator<<
                (this_00,(uint)(this->flattenedData).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar3]);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_01,
             "List property has an element with more entries than fit in a uchar. See note in README."
            );
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual void writeDataASCII(std::ostream& outStream, size_t iElement) override {
    size_t dataStart = flattenedIndexStart[iElement];
    size_t dataEnd = flattenedIndexStart[iElement + 1];

    // Get the number of list elements as a uchar, and ensure the value fits
    size_t dataCount = dataEnd - dataStart;
    if (dataCount > std::numeric_limits<uint8_t>::max()) {
      throw std::runtime_error(
          "List property has an element with more entries than fit in a uchar. See note in README.");
    }

    outStream << dataCount;
    outStream.precision(std::numeric_limits<T>::max_digits10);
    for (size_t iFlat = dataStart; iFlat < dataEnd; iFlat++) {
      outStream << " " << static_cast<typename SerializeType<T>::type>(flattenedData[iFlat]); // cast is usually a no-op
    }
  }